

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::ClassType::computeSize(ClassType *this)

{
  Scope *this_00;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar1;
  Type *pTVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  bool bVar6;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar7;
  ASTContext local_68;
  
  this_00 = &this->super_Scope;
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(this_00);
  }
  (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 0;
  if ((this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == false) {
    (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
  }
  if (this->isInterface == false) {
    local_68.lookupIndex = this->headerIndex;
    local_68.flags.m_bits = 0;
    local_68.instanceOrProc = (Symbol *)0x0;
    local_68.firstTempVar = (TempVarSymbol *)0x0;
    local_68.randomizeDetails = (RandomizeDetails *)0x0;
    local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_68.scope.ptr = this_00;
    sVar7 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(this_00);
    sVar1 = sVar7._M_begin.current;
    bVar5 = sVar1.current == sVar7._M_end.current.current;
    if (bVar5) {
      uVar3 = 0;
      bVar6 = false;
    }
    else {
      pTVar2 = DeclaredType::getType((DeclaredType *)(sVar1.current + 1));
      uVar3 = Type::getBitstreamWidth(pTVar2);
      bVar6 = uVar3 == 0;
      for (; uVar3 < 0x3fffffff9; uVar3 = uVar3 + uVar4) {
        do {
          sVar1.current = (sVar1.current)->nextInScope;
          if (sVar1.current == (Symbol *)0x0) break;
        } while ((sVar1.current)->kind != ClassProperty);
        bVar5 = sVar1.current == sVar7._M_end.current.current;
        if (bVar5) goto LAB_0023b317;
        pTVar2 = DeclaredType::getType((DeclaredType *)(sVar1.current + 1));
        uVar4 = Type::getBitstreamWidth(pTVar2);
        if (uVar4 == 0) {
          bVar6 = true;
        }
      }
      ASTContext::addDiag(&local_68,(DiagCode)0x180009,(this->super_Type).super_Symbol.location);
    }
LAB_0023b317:
    if ((bVar5) && (!bVar6)) {
      (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar3;
      (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = true;
    }
  }
  return;
}

Assistant:

void ClassType::computeSize() const {
    ensureElaborated();
    cachedBitstreamWidth = 0;
    if (isInterface)
        return;

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));

    // Note: no worry of class cycles here because we set cachedBitstreamWidth
    // to zero up above, which will avoid re-entering this function.
    uint64_t totalWidth = 0;
    bool hasDynamic = false;
    for (auto& prop : membersOfType<ClassPropertySymbol>()) {
        uint64_t width = prop.getType().getBitstreamWidth();
        if (width == 0)
            hasDynamic = true;

        totalWidth += width;
        if (totalWidth > MaxBitWidth) {
            context.addDiag(diag::ObjectTooLarge, location);
            return;
        }
    }

    if (!hasDynamic)
        cachedBitstreamWidth = totalWidth;
}